

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O2

VarType * __thiscall glu::VarType::operator=(VarType *this,VarType *other)

{
  Type TVar1;
  undefined8 uVar2;
  VarType *pVVar3;
  
  if (this != other) {
    if (this->m_type == TYPE_ARRAY) {
      pVVar3 = (this->m_data).array.elementType;
      if (pVVar3 != (VarType *)0x0) {
        ~VarType(pVVar3);
      }
      operator_delete(pVVar3,0x18);
    }
    TVar1 = other->m_type;
    this->m_type = TVar1;
    (this->m_data).array.elementType = (VarType *)0x0;
    (this->m_data).array.size = 0;
    if (TVar1 == TYPE_ARRAY) {
      pVVar3 = (VarType *)operator_new(0x18);
      VarType(pVVar3,(other->m_data).array.elementType);
      (this->m_data).array.elementType = pVVar3;
      (this->m_data).array.size = (other->m_data).array.size;
    }
    else {
      uVar2 = *(undefined8 *)((long)&other->m_data + 8);
      (this->m_data).basic = (other->m_data).basic;
      *(undefined8 *)((long)&this->m_data + 8) = uVar2;
    }
  }
  return this;
}

Assistant:

VarType& VarType::operator= (const VarType& other)
{
	if (this == &other)
		return *this; // Self-assignment.

	if (m_type == TYPE_ARRAY)
		delete m_data.array.elementType;

	m_type	= other.m_type;
	m_data	= Data();

	if (m_type == TYPE_ARRAY)
	{
		m_data.array.elementType	= new VarType(*other.m_data.array.elementType);
		m_data.array.size			= other.m_data.array.size;
	}
	else
		m_data = other.m_data;

	return *this;
}